

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::anon_unknown_0::BufferAgeTest::iterate(BufferAgeTest *this)

{
  TestContext *pTVar1;
  pointer pDVar2;
  pointer pFVar3;
  bool bVar4;
  EGLint EVar5;
  EGLint EVar6;
  deUint32 dVar7;
  int iVar8;
  Library *egl;
  pointer pFVar9;
  pointer pFVar10;
  ostream *poVar11;
  void *pvVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  int *piVar16;
  int iVar17;
  Frame *__args;
  Frame *extraout_RDX;
  Frame *extraout_RDX_00;
  Frame *pFVar18;
  Frame *extraout_RDX_01;
  Frame *frame;
  pointer __a;
  ulong uVar19;
  char *message;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *drawTypes;
  int *piVar20;
  ulong uVar21;
  pointer pFVar22;
  int iVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  EGLint currentBufferAge;
  Vec4 clearColor;
  vector<int,_std::allocator<int>_> bufferAges;
  FrameSequence frameSequence;
  Frame newFrame;
  Surface refBuffer;
  Surface currentBuffer;
  Random rnd;
  ostringstream stream;
  uint local_2dc;
  Library *local_2d8;
  int local_2d0;
  int local_2cc;
  Vec4 local_2c8;
  int local_2b8;
  undefined4 uStack_2b4;
  long local_2a8 [2];
  void *local_298;
  iterator iStack_290;
  int *local_288;
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  local_278;
  Frame local_260;
  TestLog *local_240;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  Surface local_1f8;
  Surface local_1e0;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *local_1c8;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *local_1c0;
  deRandom local_1b8;
  int *local_1a8;
  iterator iStack_1a0;
  int *local_198;
  ios_base local_138 [264];
  
  deRandom_init(&local_1b8,this->m_seed);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_240 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  EVar5 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3057);
  EVar6 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3056);
  fVar25 = deRandom_getFloat(&local_1b8);
  fVar26 = deRandom_getFloat(&local_1b8);
  local_2d8 = (Library *)CONCAT44(local_2d8._4_4_,fVar26);
  local_2c8.m_data[2] = deRandom_getFloat(&local_1b8);
  local_2c8.m_data[1] = local_2d8._0_4_;
  local_2c8.m_data[3] = 1.0;
  local_278.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288 = (int *)0x0;
  local_298 = (void *)0x0;
  iStack_290._M_current = (int *)0x0;
  local_2d8 = egl;
  local_2c8.m_data[0] = fVar25;
  if (this->m_preserveColorBuffer == true) {
    (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3094);
    dVar7 = (*local_2d8->_vptr_Library[0x1f])();
    iVar14 = 499;
    message = "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)";
  }
  else {
    (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3095);
    dVar7 = (*local_2d8->_vptr_Library[0x1f])();
    iVar14 = 0x1f5;
    message = "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)";
  }
  eglu::checkError(dVar7,message,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                   ,iVar14);
  iVar8 = EVar6 / 2;
  iVar14 = EVar5 * 2;
  __a = (pointer)0x0;
  local_1c0 = &this->m_oddFrameDrawType;
  local_1c8 = &this->m_evenFrameDrawType;
  uVar24 = 0;
  local_2d0 = EVar6;
  local_2cc = EVar5;
  do {
    iVar17 = local_2cc;
    iVar23 = local_2d0;
    tcu::Surface::Surface(&local_1e0,local_2cc,local_2d0);
    tcu::Surface::Surface(&local_1f8,iVar17,iVar23);
    local_260.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_260.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_260.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2dc = 0xffffffff;
    drawTypes = local_1c0;
    if ((uVar24 & 1) == 0) {
      drawTypes = local_1c8;
    }
    local_260.width = iVar17;
    local_260.height = iVar23;
    generateRandomFrame(&local_260,drawTypes,(Random *)&local_1b8);
    pFVar3 = local_278.
             super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (__a == local_278.
               super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((long)__a -
          (long)local_278.
                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar21 = (long)__a -
               (long)local_278.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar15 = uVar21;
      if (__a == local_278.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
        uVar15 = 1;
      }
      uVar19 = uVar15 + uVar21;
      if (0x3fffffffffffffe < uVar19) {
        uVar19 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar15,uVar21)) {
        uVar19 = 0x3ffffffffffffff;
      }
      if (uVar19 == 0) {
        pFVar9 = (pointer)0x0;
        pFVar18 = __args;
      }
      else {
        pFVar9 = (pointer)operator_new(uVar19 << 5);
        pFVar18 = extraout_RDX;
      }
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)(pFVar9 + uVar21),&local_260,pFVar18);
      pFVar22 = pFVar9;
      for (pFVar10 = pFVar3; __a != pFVar10; pFVar10 = pFVar10 + 1) {
        iVar23 = pFVar10->height;
        pFVar22->width = pFVar10->width;
        pFVar22->height = iVar23;
        pDVar2 = (pFVar10->draws).
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (pFVar22->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pFVar10->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pFVar22->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar2;
        (pFVar22->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pFVar10->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pFVar10->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pFVar10->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pFVar10->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pFVar22 = pFVar22 + 1;
      }
      if (pFVar3 != (pointer)0x0) {
        operator_delete(pFVar3,(long)local_278.
                                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pFVar3);
      }
      local_278.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar9 + uVar19;
      local_278.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_start = pFVar9;
    }
    else {
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)__a,&local_260,__args);
      pFVar22 = __a;
    }
    __a = pFVar22 + 1;
    local_278.
    super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_finish = __a;
    (*local_2d8->_vptr_Library[0x2b])
              (local_2d8,this->m_eglDisplay,this->m_eglSurface,0x313d,&local_2dc);
    dVar7 = (*local_2d8->_vptr_Library[0x1f])();
    eglu::checkError(dVar7,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &currentBufferAge)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                     ,0x205);
    iVar23 = (int)uVar24;
    if (uVar24 < local_2dc) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Fail, the age is invalid. Age: ",0x1f);
      poVar11 = (ostream *)std::ostream::operator<<((ostringstream *)&local_1a8,local_2dc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,", frameNdx: ",0xc);
      std::ostream::operator<<(poVar11,iVar23);
      pTVar1 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::stringbuf::str();
      tcu::TestContext::setTestResult
                (pTVar1,QP_TEST_RESULT_FAIL,(char *)CONCAT44(uStack_2b4,local_2b8));
LAB_00220f66:
      if ((long *)CONCAT44(uStack_2b4,local_2b8) != local_2a8) {
        operator_delete((long *)CONCAT44(uStack_2b4,local_2b8),local_2a8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
LAB_00220f9e:
      bVar4 = true;
    }
    else {
      if (((uVar24 != 0) && (local_2dc != 1)) && (this->m_preserveColorBuffer != false)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Fail, EGL_BUFFER_PRESERVED is set to true, but buffer age is: ",0x3e);
        poVar11 = (ostream *)std::ostream::operator<<((ostringstream *)&local_1a8,local_2dc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," (should be 1)",0xe);
        pTVar1 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        std::__cxx11::stringbuf::str();
        tcu::TestContext::setTestResult
                  (pTVar1,QP_TEST_RESULT_FAIL,(char *)CONCAT44(uStack_2b4,local_2b8));
        goto LAB_00220f66;
      }
      if (iStack_290._M_current == local_288) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_298,iStack_290,(int *)&local_2dc);
      }
      else {
        *iStack_290._M_current = local_2dc;
        iStack_290._M_current = iStack_290._M_current + 1;
      }
      if (9 < uVar24) {
        if ((int)local_2dc < 1) {
          (*(this->m_gl).clearColor)
                    (local_2c8.m_data[0],local_2c8.m_data[1],local_2c8.m_data[2],local_2c8.m_data[3]
                    );
          (*(this->m_gl).clear)(0x4000);
          clearColorReference(&local_1f8,&local_2c8);
LAB_0022128b:
          GLES2Renderer::render(this->m_gles2Renderer,local_2cc,local_2d0,&local_260);
          ReferenceRenderer::render((ReferenceRenderer *)&local_1f8,(Surface *)&local_260,frame);
          readPixels((Functions *)(this->m_gl).readPixels,&local_1e0);
          bVar4 = compareToReference(local_240,&local_1f8,&local_1e0,iVar23,iVar23);
          if (bVar4) {
            if (this->m_resizeType == RESIZETYPE_BEFORE_SWAP) {
              if ((uVar24 & 1) == 0) {
                piVar20 = &local_220;
                local_220 = iVar14;
                local_21c = iVar8;
              }
              else {
                piVar20 = &local_228;
                local_228 = iVar8;
                local_224 = iVar14;
              }
              (*this->m_window->_vptr_NativeWindow[6])(this->m_window,piVar20);
            }
            (*local_2d8->_vptr_Library[0x31])(local_2d8,this->m_eglDisplay,this->m_eglSurface);
            dVar7 = (*local_2d8->_vptr_Library[0x1f])();
            eglu::checkError(dVar7,"swapBuffers(m_eglDisplay, m_eglSurface)",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                             ,0x260);
            bVar4 = false;
            if (this->m_resizeType == RESIZETYPE_AFTER_SWAP) {
              iVar23 = iVar8;
              iVar17 = iVar14;
              if ((uVar24 & 1) == 0) {
                iVar23 = local_238;
                iVar17 = local_234;
                local_230 = iVar14;
                local_22c = iVar8;
              }
              local_234 = iVar17;
              local_238 = iVar23;
              (*this->m_window->_vptr_NativeWindow[6])();
            }
          }
          else {
            bVar4 = true;
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Fail, render result is wrong");
          }
          goto LAB_00220fa3;
        }
        local_1a8 = (int *)0x0;
        iStack_1a0._M_current = (int *)0x0;
        local_198 = (int *)0x0;
        iVar17 = *(int *)((long)local_298 + uVar24 * 4);
        if (iVar17 != 0) {
          uVar15 = uVar24 & 0xffffffff;
          pvVar12 = local_298;
          do {
            local_2b8 = (int)uVar15 - iVar17;
            if (iStack_1a0._M_current == local_198) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_1a8,iStack_1a0,&local_2b8);
              pvVar12 = local_298;
            }
            else {
              *iStack_1a0._M_current = local_2b8;
              iStack_1a0._M_current = iStack_1a0._M_current + 1;
            }
            uVar15 = (ulong)local_2b8;
            iVar17 = *(int *)((long)pvVar12 + uVar15 * 4);
          } while (iVar17 != 0);
          piVar16 = iStack_1a0._M_current + -1;
          piVar20 = local_1a8;
          if (local_1a8 < piVar16 && local_1a8 != iStack_1a0._M_current) {
            do {
              piVar13 = piVar20 + 1;
              iVar17 = *piVar20;
              *piVar20 = *piVar16;
              *piVar16 = iVar17;
              piVar16 = piVar16 + -1;
              piVar20 = piVar13;
            } while (piVar13 < piVar16);
          }
        }
        readPixels((Functions *)(this->m_gl).readPixels,&local_1e0);
        clearColorReference(&local_1f8,&local_2c8);
        pFVar3 = local_278.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar18 = extraout_RDX_00;
        piVar20 = local_1a8;
        if (local_1a8 != iStack_1a0._M_current) {
          do {
            ReferenceRenderer::render
                      ((ReferenceRenderer *)&local_1f8,(Surface *)(pFVar3 + *piVar20),pFVar18);
            piVar20 = piVar20 + 1;
            pFVar18 = extraout_RDX_01;
          } while (piVar20 != iStack_1a0._M_current);
        }
        bVar4 = compareToReference(local_240,&local_1f8,&local_1e0,iVar23,iVar23 - local_2dc);
        if (bVar4) {
          if (local_1a8 != (int *)0x0) {
            operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
          }
          goto LAB_0022128b;
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail, buffer content is not well preserved when age > 0");
        if (local_1a8 != (int *)0x0) {
          operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
        }
        goto LAB_00220f9e;
      }
      if (local_2dc == 0) {
        (*(this->m_gl).clearColor)
                  (local_2c8.m_data[0],local_2c8.m_data[1],local_2c8.m_data[2],local_2c8.m_data[3]);
        (*(this->m_gl).clear)(0x4000);
      }
      GLES2Renderer::render(this->m_gles2Renderer,local_2cc,local_2d0,&local_260);
      if (this->m_resizeType == RESIZETYPE_BEFORE_SWAP) {
        if ((uVar24 & 1) == 0) {
          piVar20 = &local_200;
          local_200 = iVar14;
          local_1fc = iVar8;
        }
        else {
          piVar20 = &local_208;
          local_208 = iVar8;
          local_204 = iVar14;
        }
        (*this->m_window->_vptr_NativeWindow[6])(this->m_window,piVar20);
      }
      (*local_2d8->_vptr_Library[0x31])(local_2d8,this->m_eglDisplay,this->m_eglSurface);
      dVar7 = (*local_2d8->_vptr_Library[0x1f])();
      eglu::checkError(dVar7,"swapBuffers(m_eglDisplay, m_eglSurface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                       ,0x22a);
      bVar4 = false;
      if (this->m_resizeType == RESIZETYPE_AFTER_SWAP) {
        iVar23 = iVar8;
        iVar17 = iVar14;
        if ((uVar24 & 1) == 0) {
          iVar23 = local_218;
          iVar17 = local_214;
          local_210 = iVar14;
          local_20c = iVar8;
        }
        local_214 = iVar17;
        local_218 = iVar23;
        (*this->m_window->_vptr_NativeWindow[6])();
      }
    }
LAB_00220fa3:
    if (local_260.draws.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.draws.
                      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_260.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_260.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&local_1f8);
    tcu::Surface::~Surface(&local_1e0);
    if (bVar4) goto LAB_0022158e;
    uVar24 = uVar24 + 1;
  } while (uVar24 != 0x14);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
LAB_0022158e:
  if (local_298 != (void *)0x0) {
    operator_delete(local_298,(long)local_288 - (long)local_298);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector(&local_278);
  return STOP;
}

Assistant:

TestCase::IterateResult BufferAgeTest::iterate (void)
{
	de::Random		rnd					(m_seed);
	const Library&	egl					= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log					= m_testCtx.getLog();
	const int		width				= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int		height				= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float		clearRed			= rnd.getFloat();
	const float		clearGreen			= rnd.getFloat();
	const float		clearBlue			= rnd.getFloat();
	const tcu::Vec4	clearColor			(clearRed, clearGreen, clearBlue, 1.0f);
	const int		numFrames			= 20;
	FrameSequence	frameSequence;
	vector<int>		bufferAges;

	if (m_preserveColorBuffer)
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));
	else
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		tcu::Surface					currentBuffer			(width, height);
		tcu::Surface					refBuffer				(width, height);
		Frame							newFrame				(width, height);
		EGLint							currentBufferAge		= -1;

		if (frameNdx % 2 == 0)
			generateRandomFrame(&newFrame, m_evenFrameDrawType, rnd);
		else
			generateRandomFrame(&newFrame, m_oddFrameDrawType, rnd);

		frameSequence.push_back(newFrame);

		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &currentBufferAge));

		if (currentBufferAge > frameNdx || currentBufferAge < 0) // invalid buffer age
		{
			std::ostringstream stream;
			stream << "Fail, the age is invalid. Age: " << currentBufferAge << ", frameNdx: " << frameNdx;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		if (frameNdx > 0 && m_preserveColorBuffer && currentBufferAge != 1)
		{
			std::ostringstream stream;
			stream << "Fail, EGL_BUFFER_PRESERVED is set to true, but buffer age is: " << currentBufferAge << " (should be 1)";
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		bufferAges.push_back(currentBufferAge);
		DE_ASSERT((int)bufferAges.size() == frameNdx+1);

		// during first half, just keep rendering without reading pixel back to mimic ordinary use case
		if (frameNdx < numFrames/2)
		{
			if (currentBufferAge == 0)
				clearColorScreen(m_gl, clearColor);

			m_gles2Renderer->render(width, height, newFrame);

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (frameNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (frameNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			continue;
		}

		// do verification in the second half
		if (currentBufferAge > 0) //buffer contain previous content, need to verify
		{
			const vector<int> framesOnBuffer = getFramesOnBuffer(bufferAges, frameNdx);
			readPixels(m_gl, &currentBuffer);
			clearColorReference(&refBuffer, clearColor);

			for (vector<int>::const_iterator it = framesOnBuffer.begin(); it != framesOnBuffer.end(); it++)
				m_refRenderer->render(&refBuffer, frameSequence[*it]);

			if (compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx-currentBufferAge) == false)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, buffer content is not well preserved when age > 0");
				return STOP;
			}
		}
		else // currentBufferAge == 0, content is undefined, clear the buffer, currentBufferAge < 0 is ruled out at the beginning
		{
			clearColorScreen(m_gl, clearColor);
			clearColorReference(&refBuffer, clearColor);
		}

		m_gles2Renderer->render(width, height, newFrame);
		m_refRenderer->render(&refBuffer, newFrame);

		readPixels(m_gl, &currentBuffer);

		if (compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx) == false)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, render result is wrong");
			return STOP;
		}

		if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
		{
			if (frameNdx % 2 == 0)
				m_window->setSurfaceSize(IVec2(width*2, height/2));
			else
				m_window->setSurfaceSize(IVec2(height/2, width*2));
		}

		EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));

		if (m_resizeType == RESIZETYPE_AFTER_SWAP)
		{
			if (frameNdx % 2 == 0)
				m_window->setSurfaceSize(IVec2(width*2, height/2));
			else
				m_window->setSurfaceSize(IVec2(height/2, width*2));
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}